

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
WSNTopologyBasedEnergy::SelectServalNode
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,WSNTopologyBasedEnergy *this)

{
  Scalar *pSVar1;
  double *pdVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  WSNTopologyBasedEnergy *pWVar7;
  int *piVar8;
  WSNTopologyBasedEnergy *local_128 [2];
  undefined1 local_118 [32];
  WSNTopologyBasedEnergy *local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [24];
  double local_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  Scalar local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = time((time_t *)0x0);
  pWVar7 = (WSNTopologyBasedEnergy *)(uVar6 & 0xffffffff);
  srand((uint)uVar6);
  iVar3 = rand();
  if (-1 < iVar3 % 9) {
    iVar3 = iVar3 % 9 + 1;
    do {
      iVar4 = rand();
      local_128[0] = (WSNTopologyBasedEnergy *)CONCAT44(local_128[0]._4_4_,iVar4 % 99);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pWVar7 = (WSNTopologyBasedEnergy *)__return_storage_ptr__;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,__position,(int *)local_128);
      }
      else {
        *__position._M_current = iVar4 % 99;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  local_118._16_8_ = 0;
  do {
    for (piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
      iVar3 = *piVar8;
      local_e8._16_4_ = this->node[iVar3].leaderID;
      local_e8._20_4_ = this->node[iVar3].id;
      local_e8._0_8_ = *(undefined8 *)(this->node + iVar3);
      local_e8._8_8_ = this->node[iVar3].energy;
      pSVar1 = &this->node[iVar3].color;
      local_d0 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      dStack_c8 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar2 = this->node[iVar3].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_c0 = *pdVar2;
      dStack_b8 = pdVar2[1];
      local_a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
      local_a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
      local_a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      drawCrossNode(pWVar7,&this->img,(WSNNode *)local_e8,&local_a8);
      pWVar7 = (WSNTopologyBasedEnergy *)local_e8;
      WSNNode::~WSNNode((WSNNode *)local_e8);
    }
    local_128[0] = (WSNTopologyBasedEnergy *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WSN","");
    local_f0 = 0;
    local_118._24_4_ = 0x1010000;
    local_f8 = this;
    cv::imshow((string *)local_128,(_InputArray *)(local_118 + 0x18));
    if (local_128[0] != (WSNTopologyBasedEnergy *)local_118) {
      operator_delete(local_128[0],local_118._0_8_ + 1);
    }
    if (this->Test == true) {
      cv::waitKey(0x46);
    }
    for (piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
      iVar3 = *piVar8;
      local_78 = *(double *)&this->node[iVar3].leaderID;
      local_88 = *(double *)(this->node + iVar3);
      dStack_80 = this->node[iVar3].energy;
      pSVar1 = &this->node[iVar3].color;
      local_70 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      dStack_68 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar2 = this->node[iVar3].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_60 = *pdVar2;
      dStack_58 = pdVar2[1];
      pWVar7 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
      WSNNode::NodeColor((Scalar *)&stack0xffffffffffffffb0,this->node + *piVar8);
      drawCrossNode(pWVar7,&this->img,(WSNNode *)&local_88,(Scalar *)&stack0xffffffffffffffb0);
      WSNNode::~WSNNode((WSNNode *)&local_88);
    }
    local_128[0] = (WSNTopologyBasedEnergy *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WSN","");
    local_f0 = 0;
    local_118._24_4_ = 0x1010000;
    local_f8 = this;
    cv::imshow((string *)local_128,(_InputArray *)(local_118 + 0x18));
    pWVar7 = local_128[0];
    if (local_128[0] != (WSNTopologyBasedEnergy *)local_118) {
      operator_delete(local_128[0],local_118._0_8_ + 1);
    }
    if (this->Test == true) {
      pWVar7 = (WSNTopologyBasedEnergy *)0x46;
      cv::waitKey(0x46);
    }
    uVar5 = (int)local_118._16_8_ + 1;
    local_118._16_8_ = ZEXT48(uVar5);
  } while (uVar5 != 5);
  return __return_storage_ptr__;
}

Assistant:

vector<int> WSNTopologyBasedEnergy::SelectServalNode()
{
	vector<int> SelectNodeSeq;
	vector<int>::iterator it;

	srand((int)time(0));
	int SelectNodeNum=rand()%9+1;
	for(int i=0;i<SelectNodeNum;i++)
	{
		SelectNodeSeq.push_back(rand()%99);
	}

	//闪烁表示发送信号
	for(int i=0;i<LayerNum;i++)
	{
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],Scalar(255,255,255));
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],node[*it].NodeColor());	
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
	}
	return SelectNodeSeq;
}